

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# powerset.h
# Opt level: O2

void __thiscall
wasm::analysis::FinitePowersetLattice<wasm::LocalSet_*>::FinitePowersetLattice
          (FinitePowersetLattice<wasm::LocalSet_*> *this,
          vector<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_> *setMembers)

{
  pointer ppLVar1;
  pointer ppLVar2;
  mapped_type *pmVar3;
  long lVar4;
  size_t i;
  ulong uVar5;
  
  ppLVar1 = (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>).
            _M_impl.super__Vector_impl_data._M_start;
  ppLVar2 = (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>).
            _M_impl.super__Vector_impl_data._M_finish;
  (this->intLattice).setSize = (long)ppLVar2 - (long)ppLVar1 >> 3;
  (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_start = ppLVar1;
  (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_finish = ppLVar2;
  (this->members).super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage =
       (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl
       .super__Vector_impl_data._M_end_of_storage;
  (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (setMembers->super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->memberIndices)._M_h._M_buckets = &(this->memberIndices)._M_h._M_single_bucket;
  (this->memberIndices)._M_h._M_bucket_count = 1;
  (this->memberIndices)._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->memberIndices)._M_h._M_element_count = 0;
  (this->memberIndices)._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->memberIndices)._M_h._M_rehash_policy._M_next_resize = 0;
  (this->memberIndices)._M_h._M_single_bucket = (__node_base_ptr)0x0;
  lVar4 = 0;
  for (uVar5 = 0;
      ppLVar1 = (this->members).
                super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>._M_impl.
                super__Vector_impl_data._M_start,
      uVar5 < (ulong)((long)(this->members).
                            super__Vector_base<wasm::LocalSet_*,_std::allocator<wasm::LocalSet_*>_>.
                            _M_impl.super__Vector_impl_data._M_finish - (long)ppLVar1 >> 3);
      uVar5 = uVar5 + 1) {
    pmVar3 = std::__detail::
             _Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<wasm::LocalSet_*,_std::pair<wasm::LocalSet_*const,_unsigned_long>,_std::allocator<std::pair<wasm::LocalSet_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<wasm::LocalSet_*>,_std::hash<wasm::LocalSet_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&this->memberIndices,(key_type *)((long)ppLVar1 + lVar4));
    *pmVar3 = uVar5;
    lVar4 = lVar4 + 8;
  }
  return;
}

Assistant:

FinitePowersetLattice(std::vector<T>&& setMembers)
    : intLattice(setMembers.size()), members(std::move(setMembers)) {
    for (size_t i = 0; i < members.size(); ++i) {
      memberIndices[members[i]] = i;
    }
  }